

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patrol_strategy.cpp
# Opt level: O3

void __thiscall
PatrolStrategy::generateActions(PatrolStrategy *this,PlayerSight *sight,Actions *actions)

{
  int iVar1;
  Randomizer *pRVar2;
  float fVar3;
  float fVar4;
  Vec2 VVar5;
  Vec2 pos;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar6 [16];
  
  if ((this->super_Strategy).disabled != false) {
    return;
  }
  iVar1 = sight->round;
  if (iVar1 == 1) {
    pRVar2 = Randomizer::getInstance();
    fVar3 = Randomizer::randXAxis(pRVar2);
    this->currentTarget = (int)fVar3 % 5;
    iVar1 = sight->round;
  }
  if (iVar1 % 0x28 != 1) {
    return;
  }
  this->currentTarget = this->currentTarget + ((this->currentTarget + 1) / 5) * -5 + 1;
  pRVar2 = Randomizer::getInstance();
  fVar3 = Randomizer::randXAxis(pRVar2);
  pRVar2 = Randomizer::getInstance();
  fVar4 = Randomizer::randYAxis(pRVar2);
  auVar6._0_4_ = fVar3 * 4.0;
  auVar6._4_4_ = fVar4 * 4.0;
  auVar6._8_4_ = extraout_XMM0_Db * 0.0;
  auVar6._12_4_ = extraout_XMM0_Db_00 * 0.0;
  auVar6 = divps(auVar6,_DAT_00108060);
  VVar5.x = auVar6._0_4_ + -2.0;
  VVar5.y = auVar6._4_4_ + -2.0;
  this->goal = VVar5;
  switch(this->currentTarget) {
  case 0:
    pos.x = VVar5.x + 27.0;
    pos.y = VVar5.y + 82.0;
    break;
  case 1:
    pos.x = VVar5.x + 16.0;
    pos.y = VVar5.y + 46.0;
    break;
  case 2:
    pos.x = VVar5.x + 23.0;
    pos.y = VVar5.y + 7.0;
    break;
  case 3:
    pos.x = VVar5.x + 40.0;
    pos.y = VVar5.y + 55.0;
    break;
  case 4:
    pos.x = VVar5.x + 55.0;
    pos.y = VVar5.y + 84.0;
    break;
  default:
    pos = sight->pos;
    this->goal = pos;
    goto LAB_00104bab;
  }
  this->goal = pos;
LAB_00104bab:
  Actions::emplace(actions,SelectDestination,sight->id,pos);
  return;
}

Assistant:

void PatrolStrategy::generateActions(const PlayerSight &sight, Actions *actions)
{
    CHECK_DISABLED

    if (sight.round == 1)
        currentTarget = (int)(Randomizer::getInstance()->randXAxis()) % 5;
    if (sight.round % 40 != 1)
        return;
    currentTarget = (currentTarget + 1) % 5;
    goal = Vec2(Randomizer::getInstance()->randXAxis() * 4 / MapWidth - 2,
                Randomizer::getInstance()->randYAxis() * 4 / MapHeight - 2);
    switch (currentTarget)
    {
        case 0:
            goal = goal + Vec2(27, 82);
            break;
        case 1:
            goal = goal + Vec2(16, 46);
            break;
        case 2:
            goal = goal + Vec2(23, 7);
            break;
        case 3:
            goal = goal + Vec2(40, 55);
            break;
        case 4:
            goal = goal + Vec2(55, 84);
            break;
        default:
            goal = sight.pos;
    }
    actions->emplace(SelectDestination, sight.id, goal);
}